

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_app.cpp
# Opt level: O0

bool Clasp::Cli::ClaspAppBase::parsePositional(string *t,string *out)

{
  bool bVar1;
  string *in_RSI;
  int num;
  int *in_stack_ffffffffffffffe8;
  
  bVar1 = Potassco::string_cast<int>(in_RSI,in_stack_ffffffffffffffe8);
  if (bVar1) {
    std::__cxx11::string::operator=((string *)in_RSI,"number");
  }
  else {
    std::__cxx11::string::operator=((string *)in_RSI,"file");
  }
  return true;
}

Assistant:

bool ClaspAppBase::parsePositional(const std::string& t, std::string& out) {
	int num;
	if (Potassco::string_cast(t, num)) { out = "number"; }
	else                               { out = "file";   }
	return true;
}